

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsVarSerializerDetachArrayBuffer(JsVarSerializerHandle serializerHandle)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  ChakraCoreStreamWriter *streamWriter;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    JVar2 = JsErrorNullArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = ChakraCoreStreamWriter::DetachArrayBuffer((ChakraCoreStreamWriter *)serializerHandle);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        JVar2 = JsNoError;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsVarSerializerDetachArrayBuffer(_In_ JsVarSerializerHandle serializerHandle)
{
    PARAM_NOT_NULL(serializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        if (!streamWriter->DetachArrayBuffer())
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}